

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemViewPrivate::selectAllInEditor(QAbstractItemViewPrivate *this,QWidget *editor)

{
  QLineEdit *this_00;
  QAbstractSpinBox *this_01;
  
  do {
    editor = QWidget::focusProxy(editor);
  } while (editor != (QWidget *)0x0);
  this_00 = (QLineEdit *)QMetaObject::cast((QObject *)&QLineEdit::staticMetaObject);
  if (this_00 != (QLineEdit *)0x0) {
    QLineEdit::selectAll(this_00);
  }
  this_01 = (QAbstractSpinBox *)QMetaObject::cast((QObject *)&QSpinBox::staticMetaObject);
  if ((this_01 == (QAbstractSpinBox *)0x0) &&
     (this_01 = (QAbstractSpinBox *)QMetaObject::cast((QObject *)&QDoubleSpinBox::staticMetaObject),
     this_01 == (QAbstractSpinBox *)0x0)) {
    return;
  }
  QAbstractSpinBox::selectAll(this_01);
  return;
}

Assistant:

void QAbstractItemViewPrivate::selectAllInEditor(QWidget *editor)
{
    while (QWidget *fp = editor->focusProxy())
        editor = fp;

#if QT_CONFIG(lineedit)
    if (QLineEdit *le = qobject_cast<QLineEdit*>(editor))
        le->selectAll();
#endif
#if QT_CONFIG(spinbox)
    if (QSpinBox *sb = qobject_cast<QSpinBox*>(editor))
        sb->selectAll();
    else if (QDoubleSpinBox *dsb = qobject_cast<QDoubleSpinBox*>(editor))
        dsb->selectAll();
#endif
}